

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtok.c
# Opt level: O3

char * uv__strtok(char *str,char *sep,char **itr)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  
  if ((str == (char *)0x0) && (str = *itr, str == (char *)0x0)) {
    return (char *)0x0;
  }
  cVar3 = *str;
  if (cVar3 != '\0') {
    cVar1 = *sep;
    pcVar2 = sep + 1;
    pcVar4 = str;
    do {
      while (cVar1 != '\0') {
        if (cVar3 == cVar1) {
          *itr = pcVar4 + 1;
          *pcVar4 = '\0';
          return str;
        }
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
      }
      cVar3 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
      cVar1 = *sep;
      pcVar2 = sep + 1;
    } while (cVar3 != '\0');
  }
  *itr = (char *)0x0;
  return str;
}

Assistant:

char* uv__strtok(char* str, const char* sep, char** itr) {
  const char* sep_itr;
  char* tmp;
  char* start;

  if (str == NULL)
    start = tmp = *itr;
  else
    start = tmp = str;

  if (tmp == NULL)
    return NULL;

  while (*tmp != '\0') {
    sep_itr = sep;
    while (*sep_itr != '\0') {
      if (*tmp == *sep_itr) {
        *itr = tmp + 1;
        *tmp = '\0';
        return start;
      }
      sep_itr++;
    }
    tmp++;
  }
  *itr = NULL;
  return start;
}